

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall despot::Variable::values(Variable *this,string *prefix,int num)

{
  reference pvVar1;
  size_type sVar2;
  mapped_type_conflict *pmVar3;
  int local_70;
  int i_1;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_20;
  int local_1c;
  int i;
  int num_local;
  string *prefix_local;
  Variable *this_local;
  
  local_1c = num;
  _i = prefix;
  prefix_local = (string *)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&this->values_,(long)num);
  for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
    to_string<int>(&local_60,local_20);
    std::operator+(&local_40,prefix,&local_60);
    pvVar1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->values_,(long)local_20);
    std::__cxx11::string::operator=((string *)pvVar1,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  local_70 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->values_);
    if (sVar2 <= (ulong)(long)local_70) break;
    pvVar1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->values_,(long)local_70);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->index_,pvVar1);
    *pmVar3 = local_70;
    local_70 = local_70 + 1;
  }
  return;
}

Assistant:

void Variable::values(string prefix, int num) {
	values_.resize(num);
	for (int i = 0; i < num; i++)
		values_[i] = prefix + to_string(i);

	// NOTE: Index can be computed by stripping of the prefix
	for (int i = 0; i < values_.size(); i++)
		index_[values_[i]] = i;
}